

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void serialize_tests::CSerializeMethodsTestSingle::
     SerializationOps<DataStream,serialize_tests::CSerializeMethodsTestSingle,ActionUnserialize>
               (uint32_t *obj,DataStream *s)

{
  uint32_t uVar1;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = ser_readdata32<DataStream>(s);
  *obj = uVar1;
  ::Unserialize<DataStream>(s,(bool *)(obj + 1));
  Unserialize<DataStream,char>
            (s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(obj + 2));
  Unserialize<DataStream,_char,_16>(s,(char (*) [16])(obj + 10));
  local_28.m_object = (shared_ptr<const_CTransaction> *)(obj + 0xe);
  local_28.m_params = &::TX_WITH_WITNESS;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>::Unserialize<DataStream>
            (&local_28,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CSerializeMethodsTestSingle, obj)
    {
        READWRITE(obj.intval);
        READWRITE(obj.boolval);
        READWRITE(obj.stringval);
        READWRITE(obj.charstrval);
        READWRITE(TX_WITH_WITNESS(obj.txval));
    }